

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O0

char * raptor_strdup(char *src)

{
  size_t sVar1;
  size_t len;
  char *dst;
  char *src_local;
  
  if (src == (char *)0x0) {
    src_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(src);
    src_local = (char *)raptor::Malloc(sVar1 + 1);
    memcpy(src_local,src,sVar1 + 1);
  }
  return src_local;
}

Assistant:

char* raptor_strdup(const char* src) {
    char* dst;
    size_t len;

    if (!src) {
        return nullptr;
    }

    len = strlen(src) + 1;
    dst = static_cast<char*>(raptor::Malloc(len));

    memcpy(dst, src, len);
    return dst;
}